

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O1

int tcp_dialer_set_nodelay(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  _Bool local_19 [8];
  _Bool b;
  
  iVar1 = nni_copyin_bool(local_19,buf,sz,t);
  if (arg != (void *)0x0 && iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
    *(_Bool *)((long)arg + 0x19) = local_19[0];
    nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
tcp_dialer_set_nodelay(void *arg, const void *buf, size_t sz, nni_type t)
{
	nni_tcp_dialer *d = arg;
	int             rv;
	bool            b;

	if (((rv = nni_copyin_bool(&b, buf, sz, t)) != 0) || (d == NULL)) {
		return (rv);
	}
	nni_mtx_lock(&d->mtx);
	d->nodelay = b;
	nni_mtx_unlock(&d->mtx);
	return (0);
}